

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffload.c
# Opt level: O1

void cff_vstore_done(CFF_VStoreRec *vstore,FT_Memory memory)

{
  ulong uVar1;
  long lVar2;
  
  if ((vstore->varRegionList != (CFF_VarRegion *)0x0) && (vstore->regionCount != 0)) {
    uVar1 = 0;
    do {
      ft_mem_free(memory,vstore->varRegionList[uVar1].axisList);
      vstore->varRegionList[uVar1].axisList = (CFF_AxisCoords *)0x0;
      uVar1 = uVar1 + 1;
    } while (uVar1 < vstore->regionCount);
  }
  ft_mem_free(memory,vstore->varRegionList);
  vstore->varRegionList = (CFF_VarRegion *)0x0;
  if ((vstore->varData != (CFF_VarData *)0x0) && (vstore->dataCount != 0)) {
    lVar2 = 8;
    uVar1 = 0;
    do {
      ft_mem_free(memory,*(void **)((long)&vstore->varData->regionIdxCount + lVar2));
      *(undefined8 *)((long)&vstore->varData->regionIdxCount + lVar2) = 0;
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + 0x10;
    } while (uVar1 < vstore->dataCount);
  }
  ft_mem_free(memory,vstore->varData);
  vstore->varData = (CFF_VarData *)0x0;
  return;
}

Assistant:

static void
  cff_vstore_done( CFF_VStoreRec*  vstore,
                   FT_Memory       memory )
  {
    FT_UInt  i;


    /* free regionList and axisLists */
    if ( vstore->varRegionList )
    {
      for ( i = 0; i < vstore->regionCount; i++ )
        FT_FREE( vstore->varRegionList[i].axisList );
    }
    FT_FREE( vstore->varRegionList );

    /* free varData and indices */
    if ( vstore->varData )
    {
      for ( i = 0; i < vstore->dataCount; i++ )
        FT_FREE( vstore->varData[i].regionIndices );
    }
    FT_FREE( vstore->varData );
  }